

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

void compute_vels(float (*Ix) [512],float (*Iy) [512],float (*It) [512],float (*full_vels) [512] [2]
                 ,float (*norm_vels1) [512] [2],float (*norm_vels2) [512] [2],int pic_x,int pic_y,
                 int n,float tau_D,int flag,float (*E) [512])

{
  float fVar1;
  float fVar2;
  float (*pafVar3) [512];
  int iVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  float (*pafVar8) [5];
  float *pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float (*pafVar19) [512];
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long local_1d8;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  float eigenvalues [2];
  float local_194;
  ulong local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float (*local_178) [512] [2];
  int local_16c;
  float local_168;
  float local_164;
  float local_160;
  int nrot;
  float (*local_158) [512] [2];
  float (*local_150) [512];
  float (*local_148) [512];
  float (*local_140) [512] [2];
  float (*local_138) [512];
  float (*local_130) [512];
  undefined1 local_128 [16];
  float eigenvectors [2] [2];
  float coeff [5];
  float angle;
  float length2;
  float length1;
  undefined1 local_b8 [16];
  float diff2 [2];
  float diff1 [2];
  float weight [5] [5];
  
  local_150 = E;
  local_178 = full_vels;
  local_168 = tau_D;
  local_158 = norm_vels1;
  local_148 = It;
  local_140 = norm_vels2;
  local_138 = Ix;
  local_130 = Iy;
  printf("Eigenvalue Threshold: %f\n",SUB84((double)tau_D,0));
  printf("Threshold on Raw Normal Velocities: %f\n",SUB84((double)RAW_MAG,0));
  MAX_RAW_MAG = -INFINITY;
  fflush(_stdout);
  coeff[0] = 0.0625;
  coeff[3] = 0.25;
  coeff[4] = 0.0625;
  coeff[1] = 0.25;
  coeff[2] = 0.375;
  puts("Coefficients");
  fVar24 = 0.0;
  pafVar8 = weight;
  lVar22 = 0;
  do {
    fVar26 = coeff[lVar22];
    lVar20 = 0;
    do {
      fVar23 = coeff[lVar20] * fVar26;
      (*pafVar8)[lVar20] = fVar23;
      printf("%12.8f \n",SUB84((double)fVar23,0));
      fVar24 = fVar24 + fVar23;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 5);
    putchar(10);
    lVar22 = lVar22 + 1;
    pafVar8 = pafVar8 + 1;
  } while (lVar22 != 5);
  printf("Sum=%f\n",SUB84((double)fVar24,0));
  pfVar5 = (*local_140)[0] + 1;
  pfVar7 = (*local_158)[0] + 1;
  pfVar9 = (*local_178)[0] + 1;
  lVar22 = 0;
  lVar20 = 0;
  pafVar19 = local_150;
  do {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)pfVar9 + lVar12 * 2 + -4) = 0x42c8000042c80000;
      *(undefined8 *)((long)pfVar7 + lVar12 * 2 + -4) = 0x42c8000042c80000;
      *(undefined8 *)((long)pfVar5 + lVar12 * 2 + -4) = 0x42c8000042c80000;
      *(undefined4 *)((long)*pafVar19 + lVar12) = 0;
      *(undefined4 *)((long)Imag[0] + lVar22 + lVar12) = 0;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x800);
    lVar20 = lVar20 + 1;
    pafVar19 = pafVar19 + 1;
    pfVar5 = pfVar5 + 0x400;
    pfVar7 = pfVar7 + 0x400;
    pfVar9 = pfVar9 + 0x400;
    lVar22 = lVar22 + 0x800;
  } while (lVar20 != 0x200);
  local_16c = pic_x - n;
  local_1c4 = 0;
  local_1c8 = 0;
  local_1b8 = 0;
  local_1c0 = 0;
  local_1bc = 0;
  local_190 = 0;
  if (n < local_16c) {
    lVar12 = (long)n;
    lVar20 = lVar12 * 0x804;
    lVar13 = (long)local_138 + lVar20 + -0x1008;
    lVar22 = (long)local_130 + lVar20 + -0x1008;
    lVar20 = (long)local_148 + lVar20 + -0x1008;
    local_190 = 0;
    local_1bc = 0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_1c8 = 0;
    local_1c4 = 0;
    local_1d8 = lVar12;
    do {
      lVar10 = lVar20;
      lVar14 = lVar22;
      lVar16 = lVar13;
      lVar21 = lVar12;
      if (n < pic_y - n) {
        do {
          local_160 = 0.0;
          lVar6 = -2;
          pafVar8 = weight;
          fVar24 = 1.0;
          local_164 = 0.0;
          local_194 = 0.0;
          fVar26 = 0.0;
          fStack_184 = 0.0;
          lVar11 = lVar10;
          lVar15 = lVar14;
          lVar17 = lVar16;
          do {
            lVar18 = 0;
            do {
              if (flag == 1) {
                fVar24 = *(float *)(lVar17 + lVar18 * 4);
                fVar23 = *(float *)(lVar15 + lVar18 * 4);
                fVar24 = (fVar24 * fVar24 + fVar23 * fVar23) * 0.08 + 1.0;
              }
              fVar23 = (*pafVar8)[lVar18];
              fVar25 = *(float *)(lVar17 + lVar18 * 4);
              local_194 = local_194 + (fVar25 * fVar25 * fVar23) / fVar24;
              fVar1 = *(float *)(lVar15 + lVar18 * 4);
              fVar26 = fVar26 + (fVar1 * fVar1 * fVar23) / fVar24;
              fStack_184 = fStack_184 + (fVar25 * fVar1 * fVar23) / fVar24;
              fVar2 = *(float *)(lVar11 + lVar18 * 4);
              local_164 = local_164 + (fVar25 * fVar2 * fVar23) / fVar24;
              local_160 = local_160 + (fVar1 * fVar2 * fVar23) / fVar24;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 5);
            lVar6 = lVar6 + 1;
            lVar17 = lVar17 + 0x800;
            lVar15 = lVar15 + 0x800;
            lVar11 = lVar11 + 0x800;
            pafVar8 = pafVar8 + 1;
          } while (lVar6 != 3);
          local_b8 = ZEXT416((uint)fStack_184);
          if (flag == 1) {
            local_194 = local_194 + 0.5;
            fVar26 = fVar26 + 0.5;
          }
          local_128 = ZEXT416((uint)fVar26);
          _fStack_180 = CONCAT44(fVar26,fStack_184);
          local_188 = local_194;
          jacobi((float (*) [2])&local_188,2,eigenvalues,eigenvectors,&nrot);
          iVar4 = check_eigen_calc((float (*) [2])&local_188,eigenvalues,eigenvectors,nrot,diff1,
                                   diff2,&length1,&length2,&angle);
          pafVar3 = local_130;
          pafVar19 = local_138;
          fVar24 = eigenvalues[0];
          if (iVar4 == 0) {
            local_1bc = local_1bc + 1;
          }
          else {
            if (eigenvalues[0] < eigenvalues[1]) {
              eigenvectors[0] =
                   (float  [2])((long)eigenvectors[0] << 0x20 | (ulong)eigenvectors[0] >> 0x20);
              eigenvalues[0] = eigenvalues[1];
              eigenvalues[1] = fVar24;
              eigenvectors[1] =
                   (float  [2])((long)eigenvectors[1] << 0x20 | (ulong)eigenvectors[1] >> 0x20);
            }
            fVar26 = local_194 * (float)local_128._0_4_ -
                     (float)local_b8._0_4_ * (float)local_b8._0_4_;
            fVar24 = -(float)local_b8._0_4_ / fVar26;
            if ((eigenvalues[0] < local_168) || (eigenvalues[1] < local_168)) {
              if ((eigenvalues[0] <= local_168) || (ABS(fVar26) <= 1e-08)) {
                local_1c0 = local_1c0 + 1;
              }
              else {
                fVar24 = -(((float)local_128._0_4_ / fVar26) * local_164 + local_160 * fVar24) *
                         eigenvectors[0][0] -
                         (fVar24 * local_164 + (local_194 / fVar26) * local_160) *
                         eigenvectors[1][0];
                local_158[local_1d8][lVar21][1] = -fVar24 * eigenvectors[0][0];
                local_158[local_1d8][lVar21][0] = eigenvectors[1][0] * fVar24;
                local_1c8 = local_1c8 + 1;
              }
            }
            else if (fVar26 <= 0.0) {
              local_178[local_1d8][lVar21] = (float  [2])0x42c8000042c80000;
            }
            else {
              fVar23 = ((float)local_128._0_4_ / fVar26) * local_164 + local_160 * fVar24;
              local_178[local_1d8][lVar21][1] = fVar23;
              fVar26 = -(fVar24 * local_164 + (local_194 / fVar26) * local_160);
              local_178[local_1d8][lVar21][0] = fVar26;
              fVar24 = local_150[local_1d8][lVar21];
              lVar6 = -2;
              pafVar8 = weight;
              lVar11 = lVar10;
              lVar15 = lVar14;
              lVar17 = lVar16;
              do {
                lVar18 = 0;
                do {
                  fVar25 = (*(float *)(lVar17 + lVar18 * 4) * -fVar23 +
                            *(float *)(lVar15 + lVar18 * 4) * fVar26 +
                           *(float *)(lVar11 + lVar18 * 4)) * (*pafVar8)[lVar18];
                  fVar24 = fVar24 + fVar25 * fVar25;
                  local_150[local_1d8][lVar21] = fVar24;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 5);
                lVar6 = lVar6 + 1;
                lVar17 = lVar17 + 0x800;
                lVar15 = lVar15 + 0x800;
                lVar11 = lVar11 + 0x800;
                pafVar8 = pafVar8 + 1;
              } while (lVar6 != 3);
              local_1c4 = local_1c4 + 1;
            }
          }
          fVar24 = local_138[local_1d8][lVar21] * local_138[local_1d8][lVar21] +
                   local_130[local_1d8][lVar21] * local_130[local_1d8][lVar21];
          if (fVar24 < 0.0) {
            local_128._0_4_ = fVar24;
            fVar26 = sqrtf(fVar24);
            fVar24 = (float)local_128._0_4_;
          }
          else {
            fVar26 = SQRT(fVar24);
          }
          Imag[local_1d8][lVar21] = fVar26;
          if (MAX_RAW_MAG < fVar26) {
            MAX_RAW_MAG = fVar26;
          }
          if (fVar26 <= RAW_MAG) {
            local_190 = (ulong)((int)local_190 + 1);
          }
          else {
            local_140[local_1d8][lVar21][1] =
                 (local_148[local_1d8][lVar21] * pafVar19[local_1d8][lVar21]) / fVar24;
            local_140[local_1d8][lVar21][0] =
                 (-local_148[local_1d8][lVar21] * pafVar3[local_1d8][lVar21]) / fVar24;
            local_1b8 = local_1b8 + 1;
          }
          lVar21 = lVar21 + 1;
          lVar10 = lVar10 + 4;
          lVar14 = lVar14 + 4;
          lVar16 = lVar16 + 4;
        } while (pic_y - n != (int)lVar21);
      }
      local_1d8 = local_1d8 + 1;
      lVar13 = lVar13 + 0x800;
      lVar22 = lVar22 + 0x800;
      lVar20 = lVar20 + 0x800;
    } while (local_16c != (int)local_1d8);
  }
  printf("%d full velocities computed\n",(ulong)local_1c4);
  printf("%d least squares normal velocities computed\n",(ulong)local_1c8);
  printf("%d raw normal velocities computed\n",(ulong)local_1b8);
  printf("%d locations where velocity information thresholded\n",(ulong)local_1c0);
  printf("%d locations where eigenvalue/eigenvector calculation failed\n",(ulong)local_1bc);
  printf("%d locations with spatial gradient is zero\n",local_190);
  fflush(_stdout);
  return;
}

Assistant:

void compute_vels(
float Ix[PIC_X][PIC_Y],
float Iy[PIC_X][PIC_Y],
float It[PIC_X][PIC_Y],
float full_vels[PIC_X][PIC_Y][2],
float norm_vels1[PIC_X][PIC_Y][2],
float norm_vels2[PIC_X][PIC_Y][2],
int pic_x, int pic_y, int n,
float tau_D,
int flag, float E[PIC_X][PIC_Y])
{
float mag,M[2][2],MI[2][2],B[2],denominator;
float eigenvalues[2],eigenvectors[2][2],length1,length2;
float angle,temp1,v1,v2;
float sigma1,sigma2,sigmap,temp,diff1[N],diff2[N];
int i,j,k,l,full_count,norm_count1,norm_count2,no_count,nrot,eigen_count,no_swaps;
float eigenvalues2[2],eigenvectors2[2][2],weight[5][5],sum,coeff[5],v[2];
int mag_zero;
int kk;


printf("Eigenvalue Threshold: %f\n",tau_D);
printf("Threshold on Raw Normal Velocities: %f\n",RAW_MAG);
MAX_RAW_MAG = (float) -HUGE_VAL;
mag_zero = 0;
fflush(stdout);
/* Parameter values as specified in Simoncelli, Adelson and Heeger, page 313  */
sigma1 = 0.08f;
sigma2 = 1.0f;
sigmap = 2.0f;

/* Compute weights */
sum = 0.0;
coeff[0] = coeff[4] = 0.0625;
coeff[1] = coeff[3] = 0.25;
coeff[2] = 0.375;
printf("Coefficients\n");
for(i=0;i<5;i++)
{
for(j=0;j<5;j++)
	{
	weight[i][j] = coeff[i]*coeff[j];
	printf("%12.8f \n",weight[i][j]);
	sum += weight[i][j];
	}
printf("\n");
}
printf("Sum=%f\n",sum);
full_count = 0;
norm_count1 = norm_count2 = 0;
no_count = 0;
eigen_count = 0;
no_swaps = 0;
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE;
	norm_vels1[i][j][0] = norm_vels1[i][j][1] = NO_VALUE;
	norm_vels2[i][j][0] = norm_vels2[i][j][1] = NO_VALUE;
	if(DEBUG) for(kk=0;kk<8;kk++) data[kk][i][j] = 0.0;
	Imag[i][j] = E[i][j] = 0.0;
	}

for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	M[0][0] = M[1][1] = M[0][1] = M[1][0] = 0.0;
	B[0] = B[1] = 0.0;
	mag = 1.0;
	/* Compute on 5*5 neighbourhood */
	for(k=(-2);k<=2;k++)
	for(l=(-2);l<=2;l++)
		{
		if(flag==TRUE) mag = sigma1*(Ix[i+k][j+l]*Ix[i+k][j+l]+
		                             Iy[i+k][j+l]*Iy[i+k][j+l])+sigma2;
		M[0][0] = M[0][0] + weight[k+2][l+2]*(Ix[i+k][j+l]*Ix[i+k][j+l])/mag;
		M[1][1] = M[1][1] + weight[k+2][l+2]*(Iy[i+k][j+l]*Iy[i+k][j+l])/mag;
		M[0][1] = M[0][1] + weight[k+2][l+2]*(Ix[i+k][j+l]*Iy[i+k][j+l])/mag;
		B[0] = B[0] + weight[k+2][l+2]*(Ix[i+k][j+l]*It[i+k][j+l])/mag;
		B[1] = B[1] + weight[k+2][l+2]*(Iy[i+k][j+l]*It[i+k][j+l])/mag;
		}
	if(DEBUG)
	{
	data[0][i][j] = M[0][0];
	data[1][i][j] = M[0][1];
	data[2][i][j] = M[1][1];
	data[3][i][j] = B[0];
	data[4][i][j] = B[1];
	data[5][i][j] = Ix[i][j];
	data[6][i][j] = Iy[i][j];
	data[7][i][j] = It[i][j];
	}
	M[1][0] = M[0][1]; /* The M array is symmetric */
	if(flag==TRUE)
		{
		M[0][0] = M[0][0] + 1.0f/sigmap;
		M[1][1] = M[1][1] + 1.0f/sigmap;
		}
	/* Invert 2*2 matrix */
	denominator = M[0][0]*M[1][1]-M[1][0]*M[0][1]; /* The determinant of M */
	MI[0][0] = M[1][1]/denominator;
	MI[0][1] = -M[0][1]/denominator;
	MI[1][0] = -M[1][0]/denominator;
	MI[1][1] = M[0][0]/denominator;

	jacobi(M,2,eigenvalues,eigenvectors,&nrot);
	if(check_eigen_calc(M,eigenvalues,eigenvectors,nrot,diff1,diff2,
		&length1,&length2,&angle)==FALSE)
		{
		if(FALSE)
		{
		printf("\n********************************************\n");
		printf("Fatal error: eigenvalue/eigenvector error\n");
		printf("i=%d j=%d\n",i,j);
		printf("eigenvalues: %f %f\n",eigenvalues[0],eigenvalues[1]);
		printf("eigenvector1: %f %f\n",eigenvectors[0][0],eigenvectors[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors[0][1],eigenvectors[1][1]);
		printf("\n      M:                        MI\n");
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[0][0],M[0][1],MI[0][0],MI[0][1]);
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[1][0],M[1][1],MI[1][0],MI[1][1]);
		printf("B: %f %f\n",B[0],B[1]);
		printf("Determinant of M: %f\n",denominator);
		printf("nrot: %d\n",nrot);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		/* Check eigenvalues/eigenvectors for 2*2 matrix using
		   closed form method as in Anandan's thesis */
		eigenvalues2[0] = 0.5*((M[0][0]+M[1][1]) -
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		eigenvalues2[1] = 0.5*((M[0][0]+M[1][1]) +
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		angle = (float) atan2(eigenvalues2[0]-M[0][0],M[0][1]);
		eigenvectors2[0][0] = (float) -cos(angle);
		eigenvectors2[1][0] = (float) -sin(angle);
		eigenvectors2[0][1] = (float) -sin(angle);
		eigenvectors2[1][1] = (float) cos(angle);
		printf("\nUsing Anandan's calculation:\n");
		printf("Angle of rotation: %f degrees\n",angle*180/HALF_C);
		printf("eigenvalues: %f %f\n",eigenvalues2[0],eigenvalues2[1]);
		printf("eigenvector1: %f %f\n",eigenvectors2[0][0],eigenvectors2[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors2[0][1],eigenvectors2[1][1]);
		check_eigen_calc(M,eigenvalues2,eigenvectors2,nrot,diff1,diff2,
				 &length1,&length2,&angle);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		printf("********************************************\n\n");
		fflush(stdout);
		if(FALSE) exit(1);
		}
		eigen_count++;
		}
	else
	{
	/* Sort the eigenvalues and the corresponding eigenvectors */
	/* Most likely, already ordered				   */
	if(eigenvalues[0] < eigenvalues[1]) /* Largest eigenvalue first */
		{
		/* swap eigenvalues */
		temp = eigenvalues[0];
		eigenvalues[0] = eigenvalues[1];
		eigenvalues[1] = temp;
		/* swap eigenvector components */
		temp = eigenvectors[0][0];
		eigenvectors[0][0] = eigenvectors[0][1];
		eigenvectors[0][1] = temp;
		temp = eigenvectors[1][0];
		eigenvectors[1][0] = eigenvectors[1][1];
		eigenvectors[1][1] = temp;
		no_swaps++;
		}

	/* Full velocity if spread of M is small */
	if(eigenvalues[0] >= tau_D && eigenvalues[1] >= tau_D)
	{
	if(denominator > 0.0)
		{
		full_vels[i][j][1] = -(v1= -(MI[0][0]*B[0]+MI[0][1]*B[1]));
		full_vels[i][j][0] =  (v2= -(MI[1][0]*B[0]+MI[1][1]*B[1]));
		/* Compute the residual */
		for(k=(-2);k<=2;k++)
		for(l=(-2);l<=2;l++)
			{
			temp1 = weight[k+2][l+2]*
			      (Ix[i+k][j+l]*v1+
			       Iy[i+k][j+l]*v2+It[i+k][j+l]);
			/* temp2 = weight[k+2][l+2]*It[i+k][j+l]; */
			E[i][j] += (temp1*temp1);
			}
		full_count++;
		}
	else { full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE; }
	}
	/* Normal velocity if spread of M is small in one direction only */
	else if(eigenvalues[0] > tau_D && fabs(denominator) > 0.00000001)
	/* Normal velocity if spread of MI is small in one direction only */
		{
		/* Project v onto that direction */
		v[0] = -(MI[0][0]*B[0]+MI[0][1]*B[1]);
		v[1] = -(MI[1][0]*B[0]+MI[1][1]*B[1]);
		norm_vels1[i][j][1] = -(v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[0][0];
		norm_vels1[i][j][0] = (v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[1][0];
		norm_count1++;
		/* if(i >= 50 && i <= 60 && j >= 50 && j <= 60)
		printf("Normal velocity at i:%d j:%d: %f %f\n",i,j,norm_vels1[i][j][0],norm_vels1[i][j][1]); */
		}
	else
		{
		/* printf("No velocity\n"); */
		no_count++;
		}
	}

	/* Compute type 2 normal velocity */
	mag = (Ix[i][j]*Ix[i][j] + Iy[i][j]*Iy[i][j]);
	Imag[i][j] = (float) sqrt(mag);
	if(Imag[i][j] > MAX_RAW_MAG) MAX_RAW_MAG = Imag[i][j];
	if(Imag[i][j] > RAW_MAG)
	{
	norm_vels2[i][j][1] =  It[i][j]*Ix[i][j]/mag;
	norm_vels2[i][j][0] = -It[i][j]*Iy[i][j]/mag;
	norm_count2++;
	}
	else mag_zero++;
	}

printf("%d full velocities computed\n",full_count);
printf("%d least squares normal velocities computed\n",norm_count1);
printf("%d raw normal velocities computed\n",norm_count2);
printf("%d locations where velocity information thresholded\n",no_count);
printf("%d locations where eigenvalue/eigenvector calculation failed\n",eigen_count);
printf("%d locations with spatial gradient is zero\n",mag_zero);
fflush(stdout);
if(DEBUG) for(kk=0;kk<8;kk++) fwrite(&data[kk][0][0], sizeof(float), 150*150, fd_temp[kk]);
}